

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::is_non_native_row_major_matrix(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRType *pSVar2;
  CompilerError *this_00;
  allocator local_189;
  string local_188;
  SPIRType type;
  
  if ((((this->backend).native_row_major_matrix != true) || (bVar1 = is_legacy(this), bVar1)) &&
     (bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationRowMajor), bVar1)) {
    pSVar2 = Compiler::expression_type(&this->super_Compiler,id);
    SPIRType::SPIRType(&type,pSVar2);
    if (type.columns == type.vecsize) {
      SPIRType::~SPIRType(&type);
      return true;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_188,"Row-major matrices must be square on this platform.",&local_189
              );
    CompilerError::CompilerError(this_00,&local_188);
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  return false;
}

Assistant:

bool CompilerGLSL::is_non_native_row_major_matrix(uint32_t id)
{
	// Natively supported row-major matrices do not need to be converted.
	// Legacy targets do not support row major.
	if (backend.native_row_major_matrix && !is_legacy())
		return false;

	// Non-matrix or column-major matrix types do not need to be converted.
	if (!has_decoration(id, DecorationRowMajor))
		return false;

	// Only square row-major matrices can be converted at this time.
	// Converting non-square matrices will require defining custom GLSL function that
	// swaps matrix elements while retaining the original dimensional form of the matrix.
	const auto type = expression_type(id);
	if (type.columns != type.vecsize)
		SPIRV_CROSS_THROW("Row-major matrices must be square on this platform.");

	return true;
}